

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflectance.cpp
# Opt level: O0

Spectrum * __thiscall
phyr::BxDF::sample_f
          (BxDF *this,Vector3f *wo,Vector3f *wi,Point2f *u,double *pdf,BxDFType *sampledType)

{
  undefined8 *in_RCX;
  long in_RDX;
  Vector3f *in_RSI;
  Vector3f *in_RDI;
  Point2f *in_R8;
  double *in_R9;
  double dVar1;
  Vector3f *wi_00;
  BxDF *in_stack_ffffffffffffffc0;
  undefined8 local_38;
  undefined8 local_30;
  
  wi_00 = in_RDI;
  cosineSampleHemisphere(in_R8);
  *in_RCX = in_stack_ffffffffffffffc0;
  in_RCX[1] = local_38;
  in_RCX[2] = local_30;
  if (*(double *)(in_RDX + 0x10) <= 0.0 && *(double *)(in_RDX + 0x10) != 0.0) {
    in_RCX[2] = (double)in_RCX[2] * -1.0;
  }
  dVar1 = BxDF::pdf(in_stack_ffffffffffffffc0,in_RSI,wi_00);
  *in_R9 = dVar1;
  (**(code **)((long)in_RSI->x + 0x10))(in_RDI,in_RSI,in_RDX,in_RCX);
  return (Spectrum *)wi_00;
}

Assistant:

Spectrum BxDF::sample_f(const Vector3f& wo, Vector3f* wi, const Point2f& u,
                        Real* pdf, BxDFType* sampledType) const {
    // Cosine-sample the hemisphere, flipping the direction if necessary
    *wi = cosineSampleHemisphere(u);
    if (wo.z < 0) wi->z *= -1;

    *pdf = BxDF::pdf(wo, *wi);
    return f(wo, *wi);
}